

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageMultisampleLoadStoreTests.cpp
# Opt level: O3

TestStatus *
vkt::image::anon_unknown_1::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  deInt32 *pdVar1;
  ostringstream *this;
  VkBool32 *this_00;
  bool bVar2;
  uint numDescriptors;
  Allocation *pAVar3;
  long *plVar4;
  long lVar5;
  SharedPtrStateBase *pSVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var7;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  undefined1 auVar8 [16];
  pointer pSVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  VkDescriptorPool descriptorPool;
  undefined1 descriptorSetLayout [8];
  deUint32 dVar15;
  int iVar16;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  Image *pIVar17;
  VkDeviceSize VVar18;
  Buffer *pBVar19;
  TextureFormat format;
  DescriptorSetLayoutBuilder *pDVar20;
  DescriptorPoolBuilder *pDVar21;
  undefined8 *puVar22;
  long *plVar23;
  Unique<vk::Handle<(vk::HandleType)22>_> *pUVar24;
  SharedPtrStateBase *pSVar25;
  const_iterator cVar26;
  DescriptorSetUpdateBuilder *pDVar27;
  TestLog *pTVar28;
  NotSupportedError *this_01;
  long lVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  int *piVar33;
  int iVar34;
  ulong uVar35;
  VkDeviceSize bufferSize;
  long lVar36;
  deInt32 *pdVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  VkExtent3D extent;
  ulong local_5b8;
  IVec3 imageSize;
  undefined4 uStack_59c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598;
  VkDescriptorSetLayout local_588;
  IVec3 workSize;
  VkDescriptorSet descriptorSet_1;
  UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> checksumImage;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  allDescriptorSets;
  UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> resultBuffer;
  UniquePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> msImage;
  VkDescriptorSet descriptorSet;
  VkDescriptorBufferInfo descriptorConstantsBufferInfo;
  VkDescriptorImageInfo descriptorMultiImageInfo;
  UniquePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> constantsBuffer;
  VkPhysicalDeviceFeatures features;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  allMultisampledImageViews;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_2f0;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  allChecksumImageViews;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_290;
  undefined8 local_278;
  undefined8 uStack_270;
  deUint32 local_268;
  undefined8 local_258;
  undefined8 uStack_250;
  deUint32 local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  deUint32 local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  deUint32 local_208;
  VkCommandPool local_1f8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_1f0;
  VkDescriptorPool local_1d8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_1d0;
  undefined1 local_1b8 [8];
  undefined1 auStack_1b0 [8];
  undefined1 local_1a8 [104];
  ios_base local_140 [272];
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  dVar15 = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  (*vki->_vptr_InstanceInterface[2])(vki,physDevice,&features);
  if (features.shaderStorageImageMultisample == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Multisampled storage images are not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageMultisampleLoadStoreTests.cpp"
               ,0xb9);
  }
  else {
    iVar16 = (*vki->_vptr_InstanceInterface[4])
                       (vki,physDevice,(ulong)caseDef->format,1,0,8,0,local_1b8);
    if (iVar16 == -0xb) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Format is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageMultisampleLoadStoreTests.cpp"
                 ,0xc0);
    }
    else {
      if ((caseDef->numSamples & ~local_1a8._4_4_) == 0) {
        pIVar17 = (Image *)operator_new(0x30);
        makeImageCreateInfo((VkImageCreateInfo *)&features,&caseDef->texture,caseDef->format,8,0);
        Image::Image(pIVar17,vk,device,allocator,(VkImageCreateInfo *)&features,
                     (MemoryRequirement)0x0);
        msImage.super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.
        ptr = pIVar17;
        pIVar17 = (Image *)operator_new(0x30);
        Texture::Texture((Texture *)local_1b8,&caseDef->texture,1);
        makeImageCreateInfo((VkImageCreateInfo *)&features,(Texture *)local_1b8,VK_FORMAT_R32_SINT,9
                            ,0);
        Image::Image(pIVar17,vk,device,allocator,(VkImageCreateInfo *)&features,
                     (MemoryRequirement)0x0);
        numDescriptors = (caseDef->texture).m_numLayers;
        uVar35 = (ulong)numDescriptors;
        checksumImage.super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.
        m_data.ptr = pIVar17;
        VVar18 = getOptimalUniformBufferChunkSize(vki,physDevice,4);
        pBVar19 = (Buffer *)operator_new(0x30);
        bufferSize = (long)(int)numDescriptors * VVar18;
        makeBufferCreateInfo((VkBufferCreateInfo *)&features,bufferSize,0x10);
        image::Buffer::Buffer
                  (pBVar19,vk,device,allocator,(VkBufferCreateInfo *)&features,
                   (MemoryRequirement)0x1);
        pAVar3 = (pBVar19->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        piVar33 = (int *)pAVar3->m_hostPtr;
        constantsBuffer.
        super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
             pBVar19;
        memset(piVar33,0,bufferSize);
        auVar8 = _DAT_00a99450;
        if (0 < (int)numDescriptors) {
          lVar29 = uVar35 - 1;
          auVar38._8_4_ = (int)lVar29;
          auVar38._0_8_ = lVar29;
          auVar38._12_4_ = (int)((ulong)lVar29 >> 0x20);
          uVar30 = 0;
          auVar38 = auVar38 ^ _DAT_00a99450;
          auVar39 = _DAT_00a99400;
          do {
            auVar40 = auVar39 ^ auVar8;
            if ((bool)(~(auVar40._4_4_ == auVar38._4_4_ && auVar38._0_4_ < auVar40._0_4_ ||
                        auVar38._4_4_ < auVar40._4_4_) & 1)) {
              *piVar33 = (int)uVar30;
            }
            if ((auVar40._12_4_ != auVar38._12_4_ || auVar40._8_4_ <= auVar38._8_4_) &&
                auVar40._12_4_ <= auVar38._12_4_) {
              *(int *)((long)piVar33 + VVar18) = (int)uVar30 + 1;
            }
            uVar30 = uVar30 + 2;
            lVar29 = auVar39._8_8_;
            auVar39._0_8_ = auVar39._0_8_ + 2;
            auVar39._8_8_ = lVar29 + 2;
            piVar33 = (int *)((long)piVar33 + VVar18 * 2);
          } while ((numDescriptors + 1 & 0xfffffffe) != uVar30);
        }
        ::vk::flushMappedMemoryRange
                  (vk,device,(VkDeviceMemory)(pAVar3->m_memory).m_internal,pAVar3->m_offset,
                   bufferSize);
        Texture::size(&caseDef->texture);
        format = ::vk::mapVkFormat(VK_FORMAT_R32_SINT);
        iVar16 = tcu::getPixelSize(format);
        iVar16 = iVar16 * features.robustBufferAccess * features.fullDrawIndexUint32 *
                 features.imageCubeArray;
        pBVar19 = (Buffer *)operator_new(0x30);
        VVar18 = (VkDeviceSize)iVar16;
        makeBufferCreateInfo((VkBufferCreateInfo *)&features,VVar18,2);
        image::Buffer::Buffer
                  (pBVar19,vk,device,allocator,(VkBufferCreateInfo *)&features,
                   (MemoryRequirement)0x1);
        pAVar3 = (pBVar19->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        resultBuffer.super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
        m_data.ptr = pBVar19;
        memset(pAVar3->m_hostPtr,0,VVar18);
        ::vk::flushMappedMemoryRange
                  (vk,device,(VkDeviceMemory)(pAVar3->m_memory).m_internal,pAVar3->m_offset,VVar18);
        ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
                  ((DescriptorSetLayoutBuilder *)&features);
        pDVar20 = ::vk::DescriptorSetLayoutBuilder::addBinding
                            ((DescriptorSetLayoutBuilder *)&features,
                             VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1,0x20,(VkSampler *)0x0);
        pDVar20 = ::vk::DescriptorSetLayoutBuilder::addBinding
                            (pDVar20,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
        pDVar20 = ::vk::DescriptorSetLayoutBuilder::addBinding
                            (pDVar20,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
        ::vk::DescriptorSetLayoutBuilder::build
                  ((Move<vk::Handle<(vk::HandleType)19>_> *)local_1b8,pDVar20,vk,device,0);
        descriptorSetLayout = local_1b8;
        DStack_290.m_device = (VkDevice)local_1a8._0_8_;
        DStack_290.m_allocator = (VkAllocationCallbacks *)local_1a8._8_8_;
        DStack_290.m_deviceIface = (DeviceInterface *)auStack_1b0;
        _local_1b8 = (undefined1  [16])0x0;
        local_1a8._0_16_ = (undefined1  [16])0x0;
        if (features._48_8_ != 0) {
          operator_delete((void *)features._48_8_,features._64_8_ - features._48_8_);
        }
        if (features._24_8_ != 0) {
          operator_delete((void *)features._24_8_,features._40_8_ - features._24_8_);
        }
        if (features._0_8_ != 0) {
          operator_delete((void *)features._0_8_,features._16_8_ - features._0_8_);
        }
        ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_1b8);
        pDVar21 = ::vk::DescriptorPoolBuilder::addType
                            ((DescriptorPoolBuilder *)local_1b8,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                             numDescriptors);
        pDVar21 = ::vk::DescriptorPoolBuilder::addType
                            (pDVar21,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,numDescriptors);
        pDVar21 = ::vk::DescriptorPoolBuilder::addType
                            (pDVar21,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,numDescriptors);
        ::vk::DescriptorPoolBuilder::build
                  ((Move<vk::Handle<(vk::HandleType)21>_> *)&features,pDVar21,vk,device,1,
                   numDescriptors);
        DStack_1d0.m_device = (VkDevice)features._16_8_;
        DStack_1d0.m_allocator = (VkAllocationCallbacks *)features._24_8_;
        local_1d8.m_internal._0_4_ = features.robustBufferAccess;
        local_1d8.m_internal._4_4_ = features.fullDrawIndexUint32;
        DStack_1d0.m_deviceIface = (DeviceInterface *)features._8_8_;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        if (local_1b8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1b8,local_1a8._0_8_ - (long)local_1b8);
        }
        descriptorPool.m_internal = local_1d8.m_internal;
        allDescriptorSets.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        allDescriptorSets.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        allDescriptorSets.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        allMultisampledImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        allMultisampledImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        allMultisampledImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        allChecksumImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        allChecksumImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        allChecksumImageViews.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_588.m_internal = (deUint64)descriptorSetLayout;
        bVar2 = caseDef->singleLayerBind;
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ::_M_erase_at_end(&allDescriptorSets,(pointer)0x0);
        if (bVar2 == true) {
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
          ::resize(&allDescriptorSets,(long)(caseDef->texture).m_numLayers);
          if (0 < (caseDef->texture).m_numLayers) {
            lVar29 = 8;
            lVar36 = 0;
            do {
              makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&features,vk,device,
                                descriptorPool,local_588);
              puVar22 = (undefined8 *)operator_new(0x20);
              puVar22[2] = features._16_8_;
              puVar22[3] = features._24_8_;
              *puVar22 = features._0_8_;
              puVar22[1] = features._8_8_;
              features.robustBufferAccess = 0;
              features.fullDrawIndexUint32 = 0;
              features.imageCubeArray = 0;
              features.independentBlend = 0;
              features.geometryShader = 0;
              features.tessellationShader = 0;
              features.sampleRateShading = 0;
              features.dualSrcBlend = 0;
              plVar23 = (long *)operator_new(0x20);
              *(undefined4 *)(plVar23 + 1) = 0;
              *(undefined4 *)((long)plVar23 + 0xc) = 0;
              *plVar23 = (long)&PTR__SharedPtrState_00cef4f0;
              plVar23[2] = (long)puVar22;
              *(undefined4 *)(plVar23 + 1) = 1;
              *(undefined4 *)((long)plVar23 + 0xc) = 1;
              pSVar9 = allDescriptorSets.
                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              plVar4 = *(long **)((long)&(allDescriptorSets.
                                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar29
                                 );
              if (plVar4 != plVar23) {
                if (plVar4 != (long *)0x0) {
                  LOCK();
                  plVar4 = plVar4 + 1;
                  *(int *)plVar4 = (int)*plVar4 + -1;
                  UNLOCK();
                  if ((int)*plVar4 == 0) {
                    *(undefined8 *)
                     ((long)allDescriptorSets.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar29 + -8) = 0;
                    (**(code **)(**(long **)((long)&(allDescriptorSets.
                                                                                                          
                                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr
                                            + lVar29) + 0x10))();
                  }
                  LOCK();
                  piVar33 = (int *)(*(long *)((long)&pSVar9->m_ptr + lVar29) + 0xc);
                  *piVar33 = *piVar33 + -1;
                  UNLOCK();
                  if (*piVar33 == 0) {
                    plVar4 = *(long **)((long)&pSVar9->m_ptr + lVar29);
                    if (plVar4 != (long *)0x0) {
                      (**(code **)(*plVar4 + 8))();
                    }
                    *(undefined8 *)((long)&pSVar9->m_ptr + lVar29) = 0;
                  }
                }
                *(undefined8 **)((long)pSVar9 + lVar29 + -8) = puVar22;
                *(long **)((long)&pSVar9->m_ptr + lVar29) = plVar23;
                LOCK();
                *(int *)(plVar23 + 1) = (int)plVar23[1] + 1;
                UNLOCK();
                LOCK();
                piVar33 = (int *)(*(long *)((long)&pSVar9->m_ptr + lVar29) + 0xc);
                *piVar33 = *piVar33 + 1;
                UNLOCK();
              }
              plVar4 = plVar23 + 1;
              LOCK();
              *(int *)plVar4 = (int)*plVar4 + -1;
              UNLOCK();
              if ((int)*plVar4 == 0) {
                (**(code **)(*plVar23 + 0x10))(plVar23);
              }
              piVar33 = (int *)((long)plVar23 + 0xc);
              LOCK();
              *piVar33 = *piVar33 + -1;
              UNLOCK();
              if (*piVar33 == 0) {
                (**(code **)(*plVar23 + 8))(plVar23);
              }
              auVar8 = (undefined1  [16])features._0_16_;
              if (features._0_8_ != 0) {
                local_1b8._0_4_ = features.robustBufferAccess;
                local_1b8._4_4_ = features.fullDrawIndexUint32;
                features._8_8_ = auVar8._8_8_;
                lVar5 = *(long *)features._8_8_;
                uVar10 = features._8_8_;
                features._0_16_ = auVar8;
                (**(code **)(lVar5 + 0x1e8))(uVar10,features._16_8_,features._24_8_,1,local_1b8);
              }
              features.geometryShader = 0;
              features.tessellationShader = 0;
              features.sampleRateShading = 0;
              features.dualSrcBlend = 0;
              features.robustBufferAccess = 0;
              features.fullDrawIndexUint32 = 0;
              features.imageCubeArray = 0;
              features.independentBlend = 0;
              lVar36 = lVar36 + 1;
              lVar29 = lVar29 + 0x10;
            } while (lVar36 < (caseDef->texture).m_numLayers);
          }
        }
        else {
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
          ::resize(&allDescriptorSets,1);
          makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&features,vk,device,
                            descriptorPool,local_588);
          pUVar24 = (Unique<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
          (pUVar24->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
               (VkDevice)features._16_8_;
          (pUVar24->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal
               = features._24_8_;
          (pUVar24->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
               features._0_8_;
          (pUVar24->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
               (DeviceInterface *)features._8_8_;
          features.robustBufferAccess = 0;
          features.fullDrawIndexUint32 = 0;
          features.imageCubeArray = 0;
          features.independentBlend = 0;
          features.geometryShader = 0;
          features.tessellationShader = 0;
          features.sampleRateShading = 0;
          features.dualSrcBlend = 0;
          pSVar25 = (SharedPtrStateBase *)operator_new(0x20);
          pdVar1 = &pSVar25->strongRefCount;
          pSVar25->strongRefCount = 0;
          pSVar25->weakRefCount = 0;
          pSVar25->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef4f0;
          pSVar25[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar24;
          pSVar25->strongRefCount = 1;
          pSVar25->weakRefCount = 1;
          pSVar9 = allDescriptorSets.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pSVar6 = (allDescriptorSets.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_state;
          if (pSVar6 != pSVar25) {
            if (pSVar6 != (SharedPtrStateBase *)0x0) {
              LOCK();
              pdVar37 = &pSVar6->strongRefCount;
              *pdVar37 = *pdVar37 + -1;
              UNLOCK();
              if (*pdVar37 == 0) {
                (allDescriptorSets.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr =
                     (Unique<vk::Handle<(vk::HandleType)22>_> *)0x0;
                (*(allDescriptorSets.
                   super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_state->_vptr_SharedPtrStateBase[2])
                          ();
              }
              LOCK();
              pdVar37 = &pSVar9->m_state->weakRefCount;
              *pdVar37 = *pdVar37 + -1;
              UNLOCK();
              if (*pdVar37 == 0) {
                if (pSVar9->m_state != (SharedPtrStateBase *)0x0) {
                  (*pSVar9->m_state->_vptr_SharedPtrStateBase[1])();
                }
                pSVar9->m_state = (SharedPtrStateBase *)0x0;
              }
            }
            pSVar9->m_ptr = pUVar24;
            pSVar9->m_state = pSVar25;
            LOCK();
            pSVar25->strongRefCount = pSVar25->strongRefCount + 1;
            UNLOCK();
            LOCK();
            pdVar37 = &pSVar9->m_state->weakRefCount;
            *pdVar37 = *pdVar37 + 1;
            UNLOCK();
          }
          pdVar37 = &pSVar25->weakRefCount;
          LOCK();
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            (*pSVar25->_vptr_SharedPtrStateBase[2])(pSVar25);
          }
          LOCK();
          *pdVar37 = *pdVar37 + -1;
          UNLOCK();
          if (*pdVar37 == 0) {
            (*pSVar25->_vptr_SharedPtrStateBase[1])(pSVar25);
          }
          auVar8 = (undefined1  [16])features._0_16_;
          if (features._0_8_ != 0) {
            local_1b8._0_4_ = features.robustBufferAccess;
            local_1b8._4_4_ = features.fullDrawIndexUint32;
            features._8_8_ = auVar8._8_8_;
            lVar29 = *(long *)features._8_8_;
            uVar10 = features._8_8_;
            features._0_16_ = auVar8;
            (**(code **)(lVar29 + 0x1e8))(uVar10,features._16_8_,features._24_8_,1);
          }
        }
        insertImageViews(vk,device,caseDef,caseDef->format,
                         (VkImage)((msImage.
                                    super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                                    .m_data.ptr)->m_image).
                                  super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                  m_internal,&allMultisampledImageViews);
        insertImageViews(vk,device,caseDef,VK_FORMAT_R32_SINT,
                         (VkImage)((checksumImage.
                                    super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                                    .m_data.ptr)->m_image).
                                  super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                  m_internal,&allChecksumImageViews);
        makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&features,vk,device,
                           (VkDescriptorSetLayout)descriptorSetLayout);
        uVar10 = features._0_8_;
        DStack_2f0.m_device = (VkDevice)features._16_8_;
        DStack_2f0.m_allocator = (VkAllocationCallbacks *)features._24_8_;
        DStack_2f0.m_deviceIface = (DeviceInterface *)features._8_8_;
        ::vk::createCommandPool
                  ((Move<vk::Handle<(vk::HandleType)24>_> *)&features,vk,device,2,dVar15,
                   (VkAllocationCallbacks *)0x0);
        auVar8 = (undefined1  [16])features._0_16_;
        DStack_1f0.m_device = (VkDevice)features._16_8_;
        DStack_1f0.m_allocator = (VkAllocationCallbacks *)features._24_8_;
        local_1f8.m_internal._0_4_ = features.robustBufferAccess;
        local_1f8.m_internal._4_4_ = features.fullDrawIndexUint32;
        DStack_1f0.m_deviceIface = (DeviceInterface *)features._8_8_;
        uVar11 = features._0_8_;
        features._0_16_ = auVar8;
        ::vk::allocateCommandBuffer
                  ((Move<vk::VkCommandBuffer_s_*> *)&features,vk,device,(VkCommandPool)uVar11,
                   VK_COMMAND_BUFFER_LEVEL_PRIMARY);
        uVar11 = features._0_8_;
        uVar12 = features._8_8_;
        uVar13 = features._16_8_;
        uVar14 = features._24_8_;
        if (caseDef->singleLayerBind == true) {
          workSize.m_data[2] = (caseDef->texture).m_layerSize.m_data[2];
          workSize.m_data._0_8_ = *(undefined8 *)(caseDef->texture).m_layerSize.m_data;
          local_5b8 = uVar35;
        }
        else {
          Texture::size(&caseDef->texture);
          local_5b8 = 1;
          if ((caseDef->singleLayerBind & 1U) != 0) {
            local_5b8 = uVar35;
          }
        }
        dVar15 = (caseDef->texture).m_numLayers;
        p_Var7 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)context->m_progCollection;
        imageSize.m_data._0_8_ = &local_598;
        std::__cxx11::string::_M_construct<char_const*>((string *)&imageSize,"comp_store","");
        cVar26 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                 ::find(p_Var7,(key_type *)&imageSize);
        ::vk::createShaderModule
                  ((Move<vk::Handle<(vk::HandleType)14>_> *)&features,vk,device,
                   *(ProgramBinary **)(cVar26._M_node + 2),0);
        local_1a8._0_4_ = features.geometryShader;
        local_1a8._4_4_ = features.tessellationShader;
        local_1a8._8_4_ = features.sampleRateShading;
        local_1a8._12_4_ = features.dualSrcBlend;
        local_1b8._0_4_ = features.robustBufferAccess;
        local_1b8._4_4_ = features.fullDrawIndexUint32;
        auStack_1b0._0_4_ = features.imageCubeArray;
        auStack_1b0._4_4_ = features.independentBlend;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)imageSize.m_data._0_8_ != &local_598) {
          operator_delete((void *)imageSize.m_data._0_8_,local_598._M_allocated_capacity + 1);
        }
        makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&features,vk,device,
                            (VkPipelineLayout)uVar10,(VkShaderModule)local_1b8);
        auVar39 = (undefined1  [16])features._16_16_;
        auVar8 = (undefined1  [16])features._0_16_;
        local_598._M_allocated_capacity._0_4_ = features.geometryShader;
        local_598._M_allocated_capacity._4_4_ = features.tessellationShader;
        local_598._8_4_ = features.sampleRateShading;
        local_598._12_4_ = features.dualSrcBlend;
        imageSize.m_data[0] = features.robustBufferAccess;
        imageSize.m_data[1] = features.fullDrawIndexUint32;
        imageSize.m_data[2] = features.imageCubeArray;
        uStack_59c = features.independentBlend;
        features._0_16_ = auVar8;
        features._16_16_ = auVar39;
        beginCommandBuffer(vk,(VkCommandBuffer)uVar11);
        (*vk->_vptr_DeviceInterface[0x4c])(vk,uVar11,1);
        local_218 = 1;
        uStack_210 = 1;
        subresourceRange.levelCount = 1;
        subresourceRange.baseArrayLayer = 0;
        subresourceRange.aspectMask = 1;
        subresourceRange.baseMipLevel = 0;
        subresourceRange.layerCount = dVar15;
        local_208 = dVar15;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&features,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
                   VK_IMAGE_LAYOUT_GENERAL,
                   (VkImage)((msImage.
                              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                              .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,subresourceRange);
        local_238 = 1;
        uStack_230 = 1;
        subresourceRange_00.levelCount = 1;
        subresourceRange_00.baseArrayLayer = 0;
        subresourceRange_00.aspectMask = 1;
        subresourceRange_00.baseMipLevel = 0;
        subresourceRange_00.layerCount = dVar15;
        local_228 = dVar15;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&features.multiViewport,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
                   VK_IMAGE_LAYOUT_GENERAL,
                   (VkImage)((checksumImage.
                              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                              .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,subresourceRange_00);
        (*vk->_vptr_DeviceInterface[0x6d])(vk,uVar11,1,0x800,0,0,0,0,0,2,(int)&features);
        local_588.m_internal = local_5b8;
        if (0 < (int)local_5b8) {
          lVar29 = 0;
          do {
            descriptorSet.m_internal =
                 **(deUint64 **)
                   ((long)&(allDescriptorSets.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar29);
            ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
                      ((DescriptorSetUpdateBuilder *)&features);
            pDVar27 = (DescriptorSetUpdateBuilder *)
                      ::vk::DescriptorSetUpdateBuilder::write
                                ((DescriptorSetUpdateBuilder *)&features,
                                 (int)descriptorSet.m_internal,(void *)0x0,0);
            pDVar27 = (DescriptorSetUpdateBuilder *)
                      ::vk::DescriptorSetUpdateBuilder::write
                                (pDVar27,(int)descriptorSet.m_internal,&DAT_00000001,0);
            ::vk::DescriptorSetUpdateBuilder::update(pDVar27,vk,device);
            if (features._48_8_ != 0) {
              operator_delete((void *)features._48_8_,features._64_8_ - features._48_8_);
            }
            if (features._24_8_ != 0) {
              operator_delete((void *)features._24_8_,features._40_8_ - features._24_8_);
            }
            std::
            vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
            ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
                       *)&features);
            (*vk->_vptr_DeviceInterface[0x56])(vk,uVar11,1,uVar10,0,1,&descriptorSet,0,0);
            (*vk->_vptr_DeviceInterface[0x5d])
                      (vk,uVar11,workSize.m_data._0_8_ & 0xffffffff,
                       (ulong)workSize.m_data._0_8_ >> 0x20);
            lVar29 = lVar29 + 0x10;
          } while (local_5b8 << 4 != lVar29);
        }
        endCommandBuffer(vk,(VkCommandBuffer)uVar11);
        submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)uVar11);
        if (imageSize.m_data._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(imageSize.m_data + 2),
                     (VkPipeline)imageSize.m_data._0_8_);
        }
        if (local_1b8 != (undefined1  [8])0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_1b8 + 8),
                     (VkShaderModule)local_1b8);
        }
        p_Var7 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)context->m_progCollection;
        imageSize.m_data._0_8_ = &local_598;
        std::__cxx11::string::_M_construct<char_const*>((string *)&imageSize,"comp_load","");
        cVar26 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                 ::find(p_Var7,(key_type *)&imageSize);
        ::vk::createShaderModule
                  ((Move<vk::Handle<(vk::HandleType)14>_> *)&features,vk,device,
                   *(ProgramBinary **)(cVar26._M_node + 2),0);
        local_1a8._0_4_ = features.geometryShader;
        local_1a8._4_4_ = features.tessellationShader;
        local_1a8._8_4_ = features.sampleRateShading;
        local_1a8._12_4_ = features.dualSrcBlend;
        local_1b8._0_4_ = features.robustBufferAccess;
        local_1b8._4_4_ = features.fullDrawIndexUint32;
        auStack_1b0._0_4_ = features.imageCubeArray;
        auStack_1b0._4_4_ = features.independentBlend;
        features.robustBufferAccess = 0;
        features.fullDrawIndexUint32 = 0;
        features.imageCubeArray = 0;
        features.independentBlend = 0;
        features.geometryShader = 0;
        features.tessellationShader = 0;
        features.sampleRateShading = 0;
        features.dualSrcBlend = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)imageSize.m_data._0_8_ != &local_598) {
          operator_delete((void *)imageSize.m_data._0_8_,local_598._M_allocated_capacity + 1);
        }
        makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&features,vk,device,
                            (VkPipelineLayout)uVar10,(VkShaderModule)local_1b8);
        auVar39 = (undefined1  [16])features._16_16_;
        auVar8 = (undefined1  [16])features._0_16_;
        local_598._M_allocated_capacity._0_4_ = features.geometryShader;
        local_598._M_allocated_capacity._4_4_ = features.tessellationShader;
        local_598._8_4_ = features.sampleRateShading;
        local_598._12_4_ = features.dualSrcBlend;
        imageSize.m_data[0] = features.robustBufferAccess;
        imageSize.m_data[1] = features.fullDrawIndexUint32;
        imageSize.m_data[2] = features.imageCubeArray;
        uStack_59c = features.independentBlend;
        features._0_16_ = auVar8;
        features._16_16_ = auVar39;
        beginCommandBuffer(vk,(VkCommandBuffer)uVar11);
        (*vk->_vptr_DeviceInterface[0x4c])(vk,uVar11,1,imageSize.m_data._0_8_);
        local_258 = 1;
        uStack_250 = 1;
        subresourceRange_01.levelCount = 1;
        subresourceRange_01.baseArrayLayer = 0;
        subresourceRange_01.aspectMask = 1;
        subresourceRange_01.baseMipLevel = 0;
        subresourceRange_01.layerCount = dVar15;
        local_248 = dVar15;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&features,0x40,0x20,VK_IMAGE_LAYOUT_GENERAL,
                   VK_IMAGE_LAYOUT_GENERAL,
                   (VkImage)((msImage.
                              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                              .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,subresourceRange_01);
        (*vk->_vptr_DeviceInterface[0x6d])(vk,uVar11,0x800,0x800,0,0,0,0,0,1,(int)&features);
        if (0 < (int)local_5b8) {
          local_588.m_internal = local_588.m_internal << 4;
          uVar35 = 0;
          do {
            descriptorSet_1.m_internal =
                 **(deUint64 **)
                   ((long)&(allDescriptorSets.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + uVar35);
            descriptorSet.m_internal =
                 ((constantsBuffer.
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                 object.m_internal;
            ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
                      ((DescriptorSetUpdateBuilder *)&features);
            pDVar27 = (DescriptorSetUpdateBuilder *)
                      ::vk::DescriptorSetUpdateBuilder::write
                                ((DescriptorSetUpdateBuilder *)&features,
                                 (int)descriptorSet_1.m_internal,(void *)0x0,0);
            pDVar27 = (DescriptorSetUpdateBuilder *)
                      ::vk::DescriptorSetUpdateBuilder::write
                                (pDVar27,(int)descriptorSet_1.m_internal,&DAT_00000001,0);
            pDVar27 = (DescriptorSetUpdateBuilder *)
                      ::vk::DescriptorSetUpdateBuilder::write
                                (pDVar27,(int)descriptorSet_1.m_internal,(void *)0x2,0);
            ::vk::DescriptorSetUpdateBuilder::update(pDVar27,vk,device);
            if (features._48_8_ != 0) {
              operator_delete((void *)features._48_8_,features._64_8_ - features._48_8_);
            }
            if (features._24_8_ != 0) {
              operator_delete((void *)features._24_8_,features._40_8_ - features._24_8_);
            }
            std::
            vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
            ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
                       *)&features);
            (*vk->_vptr_DeviceInterface[0x56])(vk,uVar11,1,uVar10,0,1,&descriptorSet_1,0,0);
            (*vk->_vptr_DeviceInterface[0x5d])
                      (vk,uVar11,workSize.m_data._0_8_ & 0xffffffff,
                       (ulong)workSize.m_data._0_8_ >> 0x20,(ulong)(uint)workSize.m_data[2]);
            uVar35 = uVar35 + 0x10;
          } while (local_588.m_internal != uVar35);
        }
        endCommandBuffer(vk,(VkCommandBuffer)uVar11);
        submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)uVar11);
        if (imageSize.m_data._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(imageSize.m_data + 2),
                     (VkPipeline)imageSize.m_data._0_8_);
        }
        if (local_1b8 != (undefined1  [8])0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_1b8 + 8),
                     (VkShaderModule)local_1b8);
        }
        beginCommandBuffer(vk,(VkCommandBuffer)uVar11);
        local_278 = 1;
        uStack_270 = 1;
        subresourceRange_02.levelCount = 1;
        subresourceRange_02.baseArrayLayer = 0;
        subresourceRange_02.aspectMask = 1;
        subresourceRange_02.baseMipLevel = 0;
        subresourceRange_02.layerCount = dVar15;
        local_268 = dVar15;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&features,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
                   VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                   (VkImage)((checksumImage.
                              super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                              .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,subresourceRange_02);
        dVar15 = 0;
        (*vk->_vptr_DeviceInterface[0x6d])(vk,uVar11,0x800,0x1000,0,0,0,0,0,1,(int)&features);
        extent.height = 0;
        extent.width = (caseDef->texture).m_layerSize.m_data[2];
        extent.depth = (caseDef->texture).m_numLayers;
        makeBufferImageCopy((VkBufferImageCopy *)&features,
                            *(image **)(caseDef->texture).m_layerSize.m_data,extent,dVar15);
        (*vk->_vptr_DeviceInterface[99])
                  (vk,uVar11,
                   ((checksumImage.
                     super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.
                     m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                   object.m_internal,6,
                   ((resultBuffer.
                     super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                     m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                   object.m_internal,1,(int)&features);
        makeBufferMemoryBarrier
                  ((VkBufferMemoryBarrier *)&features,0x1000,0x2000,
                   (VkBuffer)
                   ((resultBuffer.
                     super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                     m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                   object.m_internal,0,VVar18);
        (*vk->_vptr_DeviceInterface[0x6d])(vk,uVar11,0x1000,0x4000,0,0,0,1,&features,0,0);
        endCommandBuffer(vk,(VkCommandBuffer)uVar11);
        submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)uVar11);
        pAVar3 = ((resultBuffer.
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data.ptr)->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        ::vk::invalidateMappedMemoryRange
                  (vk,device,(VkDeviceMemory)(pAVar3->m_memory).m_internal,pAVar3->m_offset,VVar18);
        Texture::size(&caseDef->texture);
        if (0 < imageSize.m_data[2]) {
          iVar16 = (caseDef->texture).m_numSamples;
          piVar33 = (int *)pAVar3->m_hostPtr;
          this = (ostringstream *)(local_1b8 + 8);
          iVar34 = 0;
          do {
            if (0 < imageSize.m_data[1]) {
              iVar31 = 0;
              do {
                if (0 < imageSize.m_data[0]) {
                  iVar32 = 0;
                  do {
                    if (*piVar33 != iVar16) {
                      local_1b8 = (undefined1  [8])context->m_testCtx->m_log;
                      std::__cxx11::ostringstream::ostringstream(this);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this,
                                 "Some sample colors were incorrect at (x, y, layer) = (",0x36);
                      std::ostream::operator<<(this,iVar32);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
                      std::ostream::operator<<(this,iVar31);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
                      std::ostream::operator<<(this,iVar34);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,")",1);
                      pTVar28 = tcu::MessageBuilder::operator<<
                                          ((MessageBuilder *)local_1b8,
                                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                      features._0_8_ = pTVar28;
                      std::__cxx11::ostringstream::ostringstream
                                ((ostringstream *)&features.imageCubeArray);
                      this_00 = &features.imageCubeArray;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this_00,"Checksum value is ",0x12);
                      std::ostream::operator<<(this_00,*piVar33);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)this_00," but expected ",0xe);
                      std::ostream::operator<<(this_00,iVar16);
                      tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)&features,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
                      std::ios_base::~ios_base((ios_base *)&features.shaderStorageImageMultisample);
                      std::__cxx11::ostringstream::~ostringstream(this);
                      std::ios_base::~ios_base(local_140);
                      features._0_8_ = &features.geometryShader;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&features,"Some sample colors were incorrect","");
                      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                           (pointer)&(__return_storage_ptr__->m_description).field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&__return_storage_ptr__->m_description,features._0_8_,
                                 features._8_8_ + features._0_8_);
                      if ((VkBool32 *)features._0_8_ != &features.geometryShader) {
                        operator_delete((void *)features._0_8_,features._16_8_ + 1);
                      }
                      goto LAB_00711987;
                    }
                    piVar33 = piVar33 + 1;
                    iVar32 = iVar32 + 1;
                  } while (imageSize.m_data[0] != iVar32);
                }
                iVar31 = iVar31 + 1;
              } while (iVar31 != imageSize.m_data[1]);
            }
            iVar34 = iVar34 + 1;
          } while (iVar34 < imageSize.m_data[2]);
        }
        features._0_8_ = &features.geometryShader;
        std::__cxx11::string::_M_construct<char_const*>((string *)&features,"OK","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,features._0_8_,
                   features._8_8_ + features._0_8_);
        if ((VkBool32 *)features._0_8_ != &features.geometryShader) {
          operator_delete((void *)features._0_8_,features._16_8_ + 1);
        }
LAB_00711987:
        if (uVar11 != 0) {
          features._0_8_ = uVar11;
          (**(code **)(*(long *)uVar12 + 0x240))(uVar12,uVar13,uVar14,1);
        }
        if (local_1f8.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                    (&DStack_1f0,local_1f8);
        }
        if (uVar10 != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                    (&DStack_2f0,(VkPipelineLayout)uVar10);
        }
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ::~vector(&allChecksumImageViews);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
        ::~vector(&allMultisampledImageViews);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
        ::~vector(&allDescriptorSets);
        if (local_1d8.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                    (&DStack_1d0,local_1d8);
        }
        if (descriptorSetLayout != (undefined1  [8])0x0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                    (&DStack_290,(VkDescriptorSetLayout)descriptorSetLayout);
        }
        de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
                  (&resultBuffer.
                    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>);
        de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
                  (&constantsBuffer.
                    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>);
        de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
                  (&checksumImage.
                    super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
        de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
                  (&msImage.
                    super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>);
        return __return_storage_ptr__;
      }
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Requested sample count is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageMultisampleLoadStoreTests.cpp"
                 ,0xc3);
    }
  }
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const InstanceInterface&	vki					= context.getInstanceInterface();
	const VkPhysicalDevice		physDevice			= context.getPhysicalDevice();
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const VkDevice				device				= context.getDevice();
	const VkQueue				queue				= context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&					allocator			= context.getDefaultAllocator();

	checkRequirements(vki, physDevice, caseDef);

	// Images

	const UniquePtr<Image> msImage(new Image(
		vk, device, allocator, makeImageCreateInfo(caseDef.texture, caseDef.format, VK_IMAGE_USAGE_STORAGE_BIT, 0u), MemoryRequirement::Any));

	const UniquePtr<Image> checksumImage(new Image(
		vk, device, allocator,
		makeImageCreateInfo(Texture(caseDef.texture, 1), CHECKSUM_IMAGE_FORMAT, VK_IMAGE_USAGE_STORAGE_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 0u),
		MemoryRequirement::Any));

	// Buffer used to pass constants to the shader.

	const int			numLayers					= caseDef.texture.numLayers();
	const VkDeviceSize	bufferChunkSize				= getOptimalUniformBufferChunkSize(vki, physDevice, sizeof(deInt32));
	const VkDeviceSize	constantsBufferSizeBytes	= numLayers * bufferChunkSize;
	UniquePtr<Buffer>	constantsBuffer				(new Buffer(vk, device, allocator, makeBufferCreateInfo(constantsBufferSizeBytes, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT),
													 MemoryRequirement::HostVisible));

	{
		const Allocation&	alloc	= constantsBuffer->getAllocation();
		deUint8* const		basePtr = static_cast<deUint8*>(alloc.getHostPtr());

		deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(constantsBufferSizeBytes));

		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			deInt32* const valuePtr = reinterpret_cast<deInt32*>(basePtr + layerNdx * bufferChunkSize);
			*valuePtr = layerNdx;
		}

		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), constantsBufferSizeBytes);
	}

	const VkDeviceSize	resultBufferSizeBytes	= getImageSizeBytes(caseDef.texture.size(), CHECKSUM_IMAGE_FORMAT);
	UniquePtr<Buffer>	resultBuffer			(new Buffer(vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT),
												 MemoryRequirement::HostVisible));

	{
		const Allocation& alloc = resultBuffer->getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
	}

	// Descriptors

	Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, numLayers));

	std::vector<SharedVkDescriptorSet>	allDescriptorSets;
	std::vector<SharedVkImageView>		allMultisampledImageViews;
	std::vector<SharedVkImageView>		allChecksumImageViews;

	insertDescriptorSets(vk, device, caseDef, *descriptorPool, *descriptorSetLayout, &allDescriptorSets);
	insertImageViews	(vk, device, caseDef, caseDef.format, **msImage, &allMultisampledImageViews);
	insertImageViews	(vk, device, caseDef, CHECKSUM_IMAGE_FORMAT, **checksumImage, &allChecksumImageViews);

	// Prepare commands

	const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool			(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const tcu::IVec3				workSize				= (caseDef.singleLayerBind ? caseDef.texture.layerSize() : caseDef.texture.size());
	const int						loopNumLayers			= (caseDef.singleLayerBind ? numLayers : 1);
	const VkImageSubresourceRange	subresourceAllLayers	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, caseDef.texture.numLayers());

	// Pass 1: Write MS image
	{
		const Unique<VkShaderModule>	shaderModule	(createShaderModule	(vk, device, context.getBinaryCollection().get("comp_store"), 0));
		const Unique<VkPipeline>		pipeline		(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		beginCommandBuffer(vk, *cmdBuffer);
		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

		{
			const VkImageMemoryBarrier barriers[] =
			{
				makeImageMemoryBarrier((VkAccessFlags)0, VK_ACCESS_SHADER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL, **msImage, subresourceAllLayers),
				makeImageMemoryBarrier((VkAccessFlags)0, VK_ACCESS_SHADER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL, **checksumImage, subresourceAllLayers),
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}

		for (int layerNdx = 0; layerNdx < loopNumLayers; ++layerNdx)
		{
			const VkDescriptorSet			descriptorSet					= **allDescriptorSets[layerNdx];
			const VkDescriptorImageInfo		descriptorMultiImageInfo		= makeDescriptorImageInfo(DE_NULL, **allMultisampledImageViews[layerNdx], VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorBufferInfo	descriptorConstantsBufferInfo	= makeDescriptorBufferInfo(constantsBuffer->get(), layerNdx*bufferChunkSize, bufferChunkSize);

			DescriptorSetUpdateBuilder()
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptorConstantsBufferInfo)
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorMultiImageInfo)
				.update(vk, device);

			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
			vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), workSize.z());
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Pass 2: "Resolve" MS image in compute shader
	{
		const Unique<VkShaderModule>	shaderModule	(createShaderModule	(vk, device, context.getBinaryCollection().get("comp_load"), 0));
		const Unique<VkPipeline>		pipeline		(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		beginCommandBuffer(vk, *cmdBuffer);
		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

		{
			const VkImageMemoryBarrier barriers[] =
			{
				makeImageMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_GENERAL, **msImage, subresourceAllLayers),
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}

		for (int layerNdx = 0; layerNdx < loopNumLayers; ++layerNdx)
		{
			const VkDescriptorSet			descriptorSet					= **allDescriptorSets[layerNdx];
			const VkDescriptorImageInfo		descriptorMultiImageInfo		= makeDescriptorImageInfo(DE_NULL, **allMultisampledImageViews[layerNdx], VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorImageInfo		descriptorChecksumImageInfo		= makeDescriptorImageInfo(DE_NULL, **allChecksumImageViews[layerNdx], VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorBufferInfo	descriptorConstantsBufferInfo	= makeDescriptorBufferInfo(constantsBuffer->get(), layerNdx*bufferChunkSize, bufferChunkSize);

			DescriptorSetUpdateBuilder()
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptorConstantsBufferInfo)
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorMultiImageInfo)
				.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(2u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorChecksumImageInfo)
				.update(vk, device);

			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
			vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), workSize.z());
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Retrieve result
	{
		beginCommandBuffer(vk, *cmdBuffer);

		{
			const VkImageMemoryBarrier barriers[] =
			{
				makeImageMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT, VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **checksumImage, subresourceAllLayers),
			};
			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}
		{
			const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(caseDef.texture.layerSize()), caseDef.texture.numLayers());
			vk.cmdCopyImageToBuffer(*cmdBuffer, **checksumImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **resultBuffer, 1u, &copyRegion);
		}
		{
			const VkBufferMemoryBarrier barriers[] =
			{
				makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, **resultBuffer, 0ull, resultBufferSizeBytes),
			};
			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify
	{
		const Allocation& alloc = resultBuffer->getAllocation();
		invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);

		const IVec3		imageSize			= caseDef.texture.size();
		const deInt32*	pDataPtr			= static_cast<deInt32*>(alloc.getHostPtr());
		const deInt32	expectedChecksum	= caseDef.texture.numSamples();

		for (int layer = 0; layer < imageSize.z(); ++layer)
		for (int y = 0; y < imageSize.y(); ++y)
		for (int x = 0; x < imageSize.x(); ++x)
		{
			if (*pDataPtr != expectedChecksum)
			{
				context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Some sample colors were incorrect at (x, y, layer) = (" << x << ", " << y << ", " << layer << ")"	<< tcu::TestLog::EndMessage
					<< tcu::TestLog::Message << "Checksum value is " << *pDataPtr << " but expected " << expectedChecksum << tcu::TestLog::EndMessage;

				return tcu::TestStatus::fail("Some sample colors were incorrect");
			}
			++pDataPtr;
		}

		return tcu::TestStatus::pass("OK");
	}
}